

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::XThreadFulfiller<void>::fulfill(XThreadFulfiller<void> *this,FixVoid<void> *value)

{
  FulfillScope scope;
  FulfillScope local_1b0;
  ExceptionOr<kj::_::Void> local_1a8;
  
  XThreadPaf::FulfillScope::FulfillScope(&local_1b0,&this->target);
  if (local_1b0.obj != (XThreadPaf *)0x0) {
    local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1a8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)(local_1b0.obj + 1),&local_1a8);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_1b0);
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result = kj::mv(value);
    }
  }